

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)301>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  SupportVectorRegressor *pSVar4;
  Coefficients *pCVar5;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  Kernel *kernel;
  ModelDescription *description;
  Result result;
  pointer local_78;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  undefined1 local_40 [24];
  
  Result::Result((Result *)&local_78);
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_50,(CoreML *)&description->input_,features);
  local_78 = (pointer)local_50;
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
  pcVar2 = local_40 + 8;
  if (local_48._M_p != pcVar2) {
    operator_delete(local_48._M_p,local_40._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_78);
  if (bVar3) {
    validateRegressorInterface((Result *)local_50,description,format->specificationversion_);
    local_78 = (pointer)local_50;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
    if (local_48._M_p != pcVar2) {
      operator_delete(local_48._M_p,local_40._8_8_ + 1);
    }
    bVar3 = Result::good((Result *)&local_78);
    if (bVar3) {
      if (format->_oneof_case_[0] == 0x12d) {
        pSVar4 = (format->Type_).supportvectorregressor_;
      }
      else {
        pSVar4 = Specification::SupportVectorRegressor::default_instance();
      }
      kernel = pSVar4->kernel_;
      if (kernel == (Kernel *)0x0) {
        kernel = (Kernel *)&Specification::_Kernel_default_instance_;
      }
      validateKernel((Result *)local_50,kernel);
      local_78 = (pointer)local_50;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
      if (local_48._M_p != pcVar2) {
        operator_delete(local_48._M_p,local_40._8_8_ + 1);
      }
      bVar3 = Result::good((Result *)&local_78);
      if (bVar3) {
        if ((pSVar4->_oneof_case_[0] & 0xfffffffe) == 2) {
          pCVar5 = pSVar4->coefficients_;
          if (pCVar5 == (Coefficients *)0x0) {
            pCVar5 = (Coefficients *)&Specification::_Coefficients_default_instance_;
          }
          if ((pCVar5->alpha_).current_size_ ==
              (((pSVar4->supportVectors_).sparsesupportvectors_)->vectors_).
              super_RepeatedPtrFieldBase.current_size_) goto LAB_002b56fc;
          local_50 = (undefined1  [8])local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,
                     "The number of coefficients must match the number of support vectors.","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_50);
        }
        else {
          local_50 = (undefined1  [8])local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Must specify sparse or dense support vectors","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_50);
        }
        if (local_50 != (undefined1  [8])local_40) {
          operator_delete((void *)local_50,local_40._0_8_ + 1);
        }
        goto LAB_002b574a;
      }
    }
  }
LAB_002b56fc:
  *(pointer *)__return_storage_ptr__ = local_78;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p == &local_60) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_60._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_70._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
LAB_002b574a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorRegressor>(const Specification::Model& format) {

        Result result;
        const Specification::ModelDescription& description = format.description();

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        result = validateRegressorInterface(description, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const Specification::SupportVectorRegressor& svmSpec = format.supportvectorregressor();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Coefficient size must match the size of all support vectors
        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorRegressor::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorRegressor::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.coefficients().alpha_size() != totalSVs) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "The number of coefficients must match the number of support vectors.");
        }

        return result;

    }